

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

void guess_comptype(char *file,int32 *ispipe,int32 *isgz)

{
  int iVar1;
  size_t sVar2;
  int32 iVar3;
  
  sVar2 = strlen(file);
  *ispipe = 0;
  *isgz = 0;
  if (2 < sVar2) {
    iVar1 = strcmp(file + (sVar2 - 2),".Z");
    iVar3 = 1;
    if ((iVar1 == 0) || (iVar1 = strcmp(file + (sVar2 - 2),".z"), iVar1 == 0)) goto LAB_00109f58;
  }
  if (3 < sVar2) {
    iVar1 = strcmp(file + (sVar2 - 3),".gz");
    iVar3 = 2;
    if ((iVar1 == 0) || (iVar1 = strcmp(file + (sVar2 - 3),".GZ"), iVar1 == 0)) goto LAB_00109f58;
  }
  if (sVar2 < 5) {
    return;
  }
  iVar1 = strcmp(file + (sVar2 - 4),".bz2");
  iVar3 = 3;
  if ((iVar1 != 0) && (iVar1 = strcmp(file + (sVar2 - 4),".BZ2"), iVar1 != 0)) {
    return;
  }
LAB_00109f58:
  *ispipe = 1;
  *isgz = iVar3;
  return;
}

Assistant:

static void
guess_comptype(char const *file, int32 *ispipe, int32 *isgz)
{
    size_t k;

    k = strlen(file);
    *ispipe = 0;
    *isgz = COMP_NONE;
    if ((k > 2)
        && ((strcmp(file + k - 2, ".Z") == 0)
            || (strcmp(file + k - 2, ".z") == 0))) {
        *ispipe = 1;
        *isgz = COMP_COMPRESS;
    }
    else if ((k > 3) && ((strcmp(file + k - 3, ".gz") == 0)
                        || (strcmp(file + k - 3, ".GZ") == 0))) {
        *ispipe = 1;
        *isgz = COMP_GZIP;
    }
    else if ((k > 4) && ((strcmp(file + k - 4, ".bz2") == 0)
                        || (strcmp(file + k - 4, ".BZ2") == 0))) {
        *ispipe = 1;
        *isgz = COMP_BZIP2;
    }
}